

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O2

int exr_add_channel(exr_context_t ctxt,int part_index,char *name,exr_pixel_type_t ptype,
                   exr_perceptual_treatment_t islinear,int32_t xsamp,int32_t ysamp)

{
  long lVar1;
  int iVar2;
  exr_result_t eVar3;
  code *UNRECOVERED_JUMPTABLE;
  exr_attribute_t *peVar4;
  undefined8 uStackY_50;
  
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  if ((-1 < part_index) && (part_index < *(int *)(ctxt + 0xc4))) {
    if (*ctxt == (_priv_exr_context_t)0x3) {
      UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
      uStackY_50 = 0x15;
    }
    else {
      if (*ctxt != (_priv_exr_context_t)0x0) {
        lVar1 = *(long *)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8);
        peVar4 = *(exr_attribute_t **)(lVar1 + 0x20);
        if (peVar4 == (exr_attribute_t *)0x0) {
          eVar3 = exr_attr_list_add(ctxt,(exr_attribute_list_t *)(lVar1 + 8),"channels",
                                    EXR_ATTR_CHLIST,0,(uint8_t **)0x0,
                                    (exr_attribute_t **)(lVar1 + 0x20));
          if (eVar3 != 0) {
            return eVar3;
          }
          peVar4 = *(exr_attribute_t **)(lVar1 + 0x20);
        }
        else if (peVar4->type != EXR_ATTR_CHLIST) {
          iVar2 = (**(code **)(ctxt + 0x48))
                            (ctxt,6,"Invalid required attribute type \'%s\' for \'%s\'",
                             peVar4->type_name,"channels",*(code **)(ctxt + 0x48));
          return iVar2;
        }
        eVar3 = exr_attr_chlist_add(ctxt,(peVar4->field_6).chlist,name,ptype,islinear,xsamp,ysamp);
        return eVar3;
      }
      UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
      uStackY_50 = 8;
    }
    iVar2 = (*UNRECOVERED_JUMPTABLE)(ctxt,uStackY_50);
    return iVar2;
  }
  iVar2 = (**(code **)(ctxt + 0x48))
                    (ctxt,4,"Part index (%d) out of range",part_index,*(code **)(ctxt + 0x48));
  return iVar2;
}

Assistant:

exr_result_t
exr_add_channel (
    exr_context_t              ctxt,
    int                        part_index,
    const char*                name,
    exr_pixel_type_t           ptype,
    exr_perceptual_treatment_t islinear,
    int32_t                    xsamp,
    int32_t                    ysamp)
{
    REQ_ATTR_FIND_CREATE (channels, EXR_ATTR_CHLIST);
    if (rv == EXR_ERR_SUCCESS)
    {
        rv = exr_attr_chlist_add (
            ctxt, attr->chlist, name, ptype, islinear, xsamp, ysamp);
    }
    return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
}